

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_3::TrimSpace(anon_unknown_3 *this,Slice s)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  int local_30;
  int local_2c;
  int limit;
  int start;
  Slice s_local;
  
  s_local.data_ = s.data_;
  local_2c = 0;
  _limit = this;
  while( true ) {
    sVar3 = Slice::size((Slice *)&limit);
    bVar5 = false;
    if ((ulong)(long)local_2c < sVar3) {
      cVar1 = Slice::operator[]((Slice *)&limit,(long)local_2c);
      iVar2 = isspace((int)cVar1);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    local_2c = local_2c + 1;
  }
  sVar3 = Slice::size((Slice *)&limit);
  local_30 = (int)sVar3;
  while( true ) {
    bVar5 = false;
    if (local_2c < local_30) {
      cVar1 = Slice::operator[]((Slice *)&limit,(long)(local_30 + -1));
      iVar2 = isspace((int)cVar1);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    local_30 = local_30 + -1;
  }
  pcVar4 = Slice::data((Slice *)&limit);
  Slice::Slice((Slice *)&s_local.size_,pcVar4 + local_2c,(long)(local_30 - local_2c));
  return stack0xffffffffffffffe8;
}

Assistant:

static Slice TrimSpace(Slice s) {
  int start = 0;
  while (start < s.size() && isspace(s[start])) {
    start++;
  }
  int limit = s.size();
  while (limit > start && isspace(s[limit - 1])) {
    limit--;
  }
  return Slice(s.data() + start, limit - start);
}